

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O2

int Ronan::mystrnicmp1(char *a,char *b)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (a[lVar1] == 0) {
      return (int)lVar1;
    }
    if (b[lVar1] == 0) break;
    if (((b[lVar1] ^ a[lVar1]) & 0xdfU) != 0) {
      return 0;
    }
    lVar1 = lVar1 + 1;
  }
  return 0;
}

Assistant:

int mystrnicmp1(const char *a, const char *b)
{
    int l = 0;
    while (*a && *b)
        if ((*a++ | 0x20) != (*b++ | 0x20))
            return 0;
        else
            l++;
    return *a ? 0 : l;
}